

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O0

qint64 __thiscall
QHttpNetworkReplyPrivate::readBodyVeryFast(QHttpNetworkReplyPrivate *this,QIODevice *socket,char *b)

{
  longlong in_RDX;
  char *in_RSI;
  long in_RDI;
  qint64 haveRead;
  undefined8 local_8;
  
  local_8 = QIODevice::read(in_RSI,in_RDX);
  if (local_8 == -1) {
    local_8 = -1;
  }
  else {
    *(long *)(in_RDI + 0x110) = local_8 + *(long *)(in_RDI + 0x110);
    if (*(long *)(in_RDI + 0x110) == *(long *)(in_RDI + 0x108)) {
      *(undefined4 *)(in_RDI + 0xd0) = 4;
    }
  }
  return local_8;
}

Assistant:

qint64 QHttpNetworkReplyPrivate::readBodyVeryFast(QIODevice *socket, char *b)
{
    // This first read is to flush the buffer inside the socket
    qint64 haveRead = 0;
    haveRead = socket->read(b, bodyLength - contentRead);
    if (haveRead == -1) {
        return -1;
    }
    contentRead += haveRead;

    if (contentRead == bodyLength) {
        state = AllDoneState;
    }

    return haveRead;
}